

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey_conflict *pubkey)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  secp256k1_scalar m;
  uchar c [32];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej pubkeyj;
  secp256k1_scalar local_2a8;
  secp256k1_scalar local_288;
  secp256k1_ge local_260;
  secp256k1_fe local_208;
  secp256k1_scalar local_1d8;
  uchar local_1b8 [32];
  secp256k1_scalar local_198;
  secp256k1_scalar local_178;
  secp256k1_scalar local_158;
  secp256k1_gej local_138;
  undefined1 local_b8 [104];
  undefined1 local_50 [16];
  int local_40;
  
  if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_verify_cold_3();
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_verify_cold_2();
  }
  else if (pubkey == (secp256k1_pubkey_conflict *)0x0) {
    secp256k1_ecdsa_verify_cold_1();
  }
  else {
    secp256k1_scalar_set_b32(&local_1d8,msghash32,(int *)0x0);
    local_288.d[0] = *(uint64_t *)sig->data;
    local_288.d[1] = *(uint64_t *)(sig->data + 8);
    local_288.d[2] = *(uint64_t *)(sig->data + 0x10);
    local_288.d[3] = *(uint64_t *)(sig->data + 0x18);
    uVar1 = *(ulong *)(sig->data + 0x20);
    uVar2 = *(ulong *)(sig->data + 0x28);
    uVar3 = *(uint64_t *)(sig->data + 0x30);
    uVar4 = *(ulong *)(sig->data + 0x38);
    uVar5 = -(int)((long)uVar4 >> 0x3f);
    uVar8 = uVar5 ^ 1;
    uVar7 = uVar8;
    if (uVar3 == 0xffffffffffffffff) {
      uVar7 = 0;
    }
    if (0x5d576e7357a4501c < uVar2) {
      uVar8 = 0;
    }
    uVar8 = (uVar8 | uVar7 | uVar4 < 0x7fffffffffffffff) ^ 1;
    uVar7 = 0;
    if (0xdfe92f46681b20a0 < uVar1) {
      uVar7 = uVar8;
    }
    if (0x5d576e7357a4501d < uVar2) {
      uVar7 = uVar8;
    }
    if (uVar7 != 0 || uVar5 != 0) {
      return 0;
    }
    local_2a8.d[0] = uVar1;
    local_2a8.d[1] = uVar2;
    local_2a8.d[2] = uVar3;
    local_2a8.d[3] = uVar4;
    iVar6 = secp256k1_pubkey_load(ctx,&local_260,pubkey);
    if (iVar6 == 0) {
      return 0;
    }
    auVar10._0_4_ = -(uint)((int)local_288.d[0] == 0 && (int)local_288.d[2] == 0);
    auVar10._4_4_ = -(uint)(local_288.d[0]._4_4_ == 0 && local_288.d[2]._4_4_ == 0);
    auVar10._8_4_ = -(uint)((int)local_288.d[1] == 0 && (int)local_288.d[3] == 0);
    auVar10._12_4_ = -(uint)(local_288.d[1]._4_4_ == 0 && local_288.d[3]._4_4_ == 0);
    iVar6 = movmskps(iVar6,auVar10);
    if ((iVar6 != 0xf) && (((uVar3 != 0 || uVar4 != 0) || uVar2 != 0) || uVar1 != 0)) {
      secp256k1_scalar_inverse_var(&local_158,&local_2a8);
      secp256k1_scalar_mul(&local_178,&local_158,&local_1d8);
      secp256k1_scalar_mul(&local_198,&local_158,&local_288);
      local_40 = local_260.infinity;
      local_b8._0_8_ = local_260.x.n[0];
      local_b8._8_8_ = local_260.x.n[1];
      local_b8._16_8_ = local_260.x.n[2];
      local_b8._24_8_ = local_260.x.n[3];
      local_b8._32_8_ = local_260.x.n[4];
      local_b8._40_8_ = local_260.y.n[0];
      local_b8._48_8_ = local_260.y.n[1];
      local_b8._56_8_ = local_260.y.n[2];
      local_b8._64_8_ = local_260.y.n[3];
      local_b8._72_8_ = local_260.y.n[4];
      local_b8._80_8_ = 1;
      local_b8._88_16_ = (undefined1  [16])0x0;
      local_50 = (undefined1  [16])0x0;
      secp256k1_ecmult(&local_138,(secp256k1_gej *)local_b8,&local_198,&local_178);
      if (local_138.infinity == 0) {
        secp256k1_scalar_get_b32(local_1b8,&local_288);
        secp256k1_fe_set_b32(&local_208,local_1b8);
        iVar6 = secp256k1_gej_eq_x_var(&local_208,&local_138);
        if (iVar6 != 0) {
          return 1;
        }
        uVar7 = 4;
        do {
          uVar1 = secp256k1_ecdsa_const_p_minus_order.n[uVar7];
          uVar2 = local_208.n[uVar7];
          if (uVar2 >= uVar1 && uVar2 != uVar1) {
            return 0;
          }
          if (uVar2 < uVar1) {
            local_208.n[0] = local_208.n[0] + 0x25e8cd0364141;
            local_208.n[1] = local_208.n[1] + 0xe6af48a03bbfd;
            local_208.n[2] = local_208.n[2] + 0xffffffebaaedc;
            local_208.n[3] = local_208.n[3] + 0xfffffffffffff;
            local_208.n[4] = local_208.n[4] + 0xffffffffffff;
            iVar6 = secp256k1_gej_eq_x_var(&local_208,&local_138);
            return iVar6;
          }
          bVar9 = uVar7 != 0;
          uVar7 = uVar7 - 1;
        } while (bVar9);
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}